

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall
FxDoWhileLoop::FxDoWhileLoop
          (FxDoWhileLoop *this,FxExpression *condition,FxExpression *code,FScriptPosition *pos)

{
  (this->super_FxLoopStatement).super_FxExpression._vptr_FxExpression =
       (_func_int **)&PTR__FxExpression_0070d370;
  FScriptPosition::FScriptPosition
            (&(this->super_FxLoopStatement).super_FxExpression.ScriptPosition,pos);
  (this->super_FxLoopStatement).super_FxExpression.isresolved = false;
  (this->super_FxLoopStatement).super_FxExpression.NeedResult = true;
  (this->super_FxLoopStatement).super_FxExpression.ExprType = EFX_DoWhileLoop;
  (this->super_FxLoopStatement).Jumps.Array = (FxJumpStatement **)0x0;
  (this->super_FxLoopStatement).Jumps.Most = 0;
  (this->super_FxLoopStatement).Jumps.Count = 0;
  (this->super_FxLoopStatement).super_FxExpression._vptr_FxExpression =
       (_func_int **)&PTR__FxDoWhileLoop_0070cf50;
  this->Condition = condition;
  this->Code = code;
  (this->super_FxLoopStatement).super_FxExpression.ValueType = &TypeVoid->super_PType;
  return;
}

Assistant:

FxDoWhileLoop::FxDoWhileLoop(FxExpression *condition, FxExpression *code, const FScriptPosition &pos)
: FxLoopStatement(EFX_DoWhileLoop, pos), Condition(condition), Code(code)
{
	ValueType = TypeVoid;
}